

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::collapseAccessChain(Builder *this)

{
  Id IVar1;
  StorageClass storageClass_00;
  size_type sVar2;
  StorageClass storageClass;
  Builder *this_local;
  
  if (((this->accessChain).isRValue & 1U) == 0) {
    sVar2 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                      (&(this->accessChain).indexChain);
    if (sVar2 == 0) {
      this_local._4_4_ = (this->accessChain).base;
    }
    else {
      if ((this->accessChain).instr == 0) {
        IVar1 = getTypeId(this,(this->accessChain).base);
        storageClass_00 = Module::getStorageClass(&this->module,IVar1);
        IVar1 = createAccessChain(this,storageClass_00,(this->accessChain).base,
                                  &(this->accessChain).indexChain);
        (this->accessChain).instr = IVar1;
      }
      this_local._4_4_ = (this->accessChain).instr;
    }
    return this_local._4_4_;
  }
  __assert_fail("accessChain.isRValue == false",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0xa43,"Id spv::Builder::collapseAccessChain()");
}

Assistant:

Id Builder::collapseAccessChain()
{
    assert(accessChain.isRValue == false);

    if (accessChain.indexChain.size() > 0) {
        if (accessChain.instr == 0) {
            StorageClass storageClass = (StorageClass)module.getStorageClass(getTypeId(accessChain.base));
            accessChain.instr = createAccessChain(storageClass, accessChain.base, accessChain.indexChain);
        }

        return accessChain.instr;
    } else
        return accessChain.base;

    // note that non-trivial swizzling is left pending...
}